

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
                *message,uint tag,Visitor *visitor)

{
  uint uVar1;
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_01;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_02;
  type_by_index_t<4UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_03;
  type_by_index_t<5UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_04;
  type_by_index_t<6UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_05;
  type_by_index_t<7UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_06;
  type_by_index_t<8UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_07;
  type_by_index_t<9UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_08;
  type_by_index_t<10UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *field_09;
  int dummy [12];
  int local_2c;
  Visitor *pVStack_28;
  int index;
  Visitor *visitor_local;
  tuple<Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<400U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<404U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<441U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<402U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<403U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<405U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<406U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<407U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *ptStack_18;
  uint tag_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *message_local;
  
  local_2c = -1;
  pVStack_28 = visitor;
  visitor_local._4_4_ = tag;
  ptStack_18 = message;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (tag,field,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_00,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_01 = meta::
             get<2ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_01,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_02 = meta::
             get<3ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_02,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_03 = meta::
             get<4ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_03,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_04 = meta::
             get<5ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<5ul,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_04,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_05 = meta::
             get<6ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<6ul,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_05,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_06 = meta::
             get<7ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<7ul,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_06,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_07 = meta::
             get<8ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<8ul,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_07,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_08 = meta::
             get<9ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<9ul,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_08,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_09 = meta::
             get<10ul,Fixpp::FieldRef<Fixpp::TagT<399u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<400u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<404u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<441u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<402u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<403u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<405u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<406u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<407u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>>
                       (ptStack_18);
  doVisitSingleField<10ul,Fixpp::FieldRef<Fixpp::TagT<408u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>>::Visitor>
            (uVar1,field_09,pVStack_28,&local_2c);
  if (local_2c != -1) {
    std::bitset<11UL>::set
              ((bitset<11UL> *)
               &ptStack_18[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<399U,_Fixpp::Type::Int>_>,_false>
                .value.m_view.second,(long)local_2c,true);
  }
  return local_2c != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }